

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jieba.cc
# Opt level: O0

jieba_token_t * convert_tokens(vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *words)

{
  size_type sVar1;
  jieba_token_t *pjVar2;
  size_t sVar3;
  vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *in_RDI;
  value_type word;
  size_t i;
  jieba_token_t *res;
  size_t len;
  Word *in_stack_ffffffffffffff88;
  Word *in_stack_ffffffffffffff90;
  jieba_token_t *pjVar4;
  uint32_t local_30;
  uint32_t local_2c;
  uint32_t local_28;
  ulong local_20;
  
  sVar1 = std::vector<cppjieba::Word,_std::allocator<cppjieba::Word>_>::size(in_RDI);
  pjVar2 = (jieba_token_t *)malloc((sVar1 + 1) * 0x18);
  for (local_20 = 0; local_20 < sVar1; local_20 = local_20 + 1) {
    std::vector<cppjieba::Word,_std::allocator<cppjieba::Word>_>::operator[](in_RDI,local_20);
    cppjieba::Word::Word(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    pjVar2[local_20].offset = local_30;
    sVar3 = std::__cxx11::string::size();
    pjVar2[local_20].length = sVar3;
    pjVar2[local_20].unicode_offset = local_2c;
    pjVar2[local_20].unicode_length = local_28;
    cppjieba::Word::~Word((Word *)0x13ed4b);
  }
  pjVar4 = pjVar2;
  sVar1 = std::vector<cppjieba::Word,_std::allocator<cppjieba::Word>_>::size(in_RDI);
  pjVar4[sVar1].offset = 0;
  sVar1 = std::vector<cppjieba::Word,_std::allocator<cppjieba::Word>_>::size(in_RDI);
  pjVar2[sVar1].length = 0;
  sVar1 = std::vector<cppjieba::Word,_std::allocator<cppjieba::Word>_>::size(in_RDI);
  pjVar2[sVar1].unicode_offset = 0;
  sVar1 = std::vector<cppjieba::Word,_std::allocator<cppjieba::Word>_>::size(in_RDI);
  pjVar2[sVar1].unicode_length = 0;
  return pjVar2;
}

Assistant:

static jieba_token_t* convert_tokens(const std::vector<cppjieba::Word>& words) {
    size_t len = words.size();
    jieba_token_t* res = static_cast<jieba_token_t*>(malloc(sizeof(jieba_token_t) * (len + 1)));
    for (size_t i = 0; i < len; i++) {
      auto word = words[i];
      res[i].offset = word.offset;
      res[i].length = word.word.size();
      res[i].unicode_offset = word.unicode_offset;
      res[i].unicode_length = word.unicode_length;
    }
    res[words.size()].offset = 0;
    res[words.size()].length = 0;
    res[words.size()].unicode_offset = 0;
    res[words.size()].unicode_length = 0;
    return res;
}